

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void * MoveUnitsUp(CPpmd8 *p,void *oldPtr,uint nu)

{
  uint indx_00;
  uint local_44;
  UInt32 *pUStack_40;
  UInt32 n;
  UInt32 *z;
  UInt32 *d;
  void *ptr;
  uint indx;
  uint nu_local;
  void *oldPtr_local;
  CPpmd8 *p_local;
  
  indx_00 = (uint)p->Units2Indx[nu - 1];
  p_local = (CPpmd8 *)oldPtr;
  if ((oldPtr <= p->UnitsStart + 0x4000) &&
     ((uint)((int)oldPtr - (int)p->Base) <= p->FreeList[indx_00])) {
    p_local = (CPpmd8 *)RemoveNode(p,indx_00);
    local_44 = nu;
    pUStack_40 = (UInt32 *)oldPtr;
    z = (UInt32 *)p_local;
    do {
      *z = *pUStack_40;
      z[1] = pUStack_40[1];
      z[2] = pUStack_40[2];
      pUStack_40 = pUStack_40 + 3;
      z = z + 3;
      local_44 = local_44 - 1;
    } while (local_44 != 0);
    if ((Byte *)oldPtr == p->UnitsStart) {
      p->UnitsStart = p->UnitsStart + (uint)p->Indx2Units[indx_00] * 0xc;
    }
    else {
      InsertNode(p,oldPtr,indx_00);
    }
  }
  return p_local;
}

Assistant:

static void *MoveUnitsUp(CPpmd8 *p, void *oldPtr, unsigned nu)
{
  unsigned indx = U2I(nu);
  void *ptr;
  if ((Byte *)oldPtr > p->UnitsStart + 16 * 1024 || REF(oldPtr) > p->FreeList[indx])
    return oldPtr;
  ptr = RemoveNode(p, indx);
  MyMem12Cpy(ptr, oldPtr, nu);
  if ((Byte*)oldPtr != p->UnitsStart)
    InsertNode(p, oldPtr, indx);
  else
    p->UnitsStart += U2B(I2U(indx));
  return ptr;
}